

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitArrayFill(PrintExpressionContents *this,ArrayFill *curr)

{
  ostream *stream;
  bool bVar1;
  HeapType type;
  TypeNamePrinter local_78;
  
  bVar1 = printUnreachableOrNullReplacement(this,curr->ref);
  if (!bVar1) {
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(stream,"array.fill ",0xb);
    Colors::outputColorCode(stream,"\x1b[0m");
    local_78.wasm = this->wasm;
    local_78.os = this->o;
    local_78.currHeapTypeDepth = 0;
    local_78.heapTypeDepths._M_h._M_buckets = &local_78.heapTypeDepths._M_h._M_single_bucket;
    local_78.heapTypeDepths._M_h._M_bucket_count = 1;
    local_78.heapTypeDepths._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_78.heapTypeDepths._M_h._M_element_count = 0;
    local_78.heapTypeDepths._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_78.heapTypeDepths._M_h._M_rehash_policy._M_next_resize = 0;
    local_78.heapTypeDepths._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_78.prints = 0;
    type = wasm::Type::getHeapType(&curr->ref->type);
    anon_unknown_217::TypeNamePrinter::print(&local_78,type);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_78.heapTypeDepths._M_h);
  }
  return;
}

Assistant:

void visitArrayFill(ArrayFill* curr) {
    if (printUnreachableOrNullReplacement(curr->ref)) {
      return;
    }
    printMedium(o, "array.fill ");
    TypeNamePrinter(o, wasm).print(curr->ref->type.getHeapType());
  }